

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O0

void ihevc_intra_pred_luma_ver_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  short sVar13;
  int iVar14;
  ulong *puVar15;
  int in_ECX;
  ulong *in_RDX;
  long in_RDI;
  int in_R8D;
  __m128i src_temp3;
  __m128i src_temp2;
  __m128i src_temp1;
  __m128i src_temp0;
  WORD32 two_nt;
  WORD16 s2_predpixel;
  WORD32 row;
  int local_77c;
  int local_6c8;
  ulong *local_6b8;
  uint local_178;
  uint local_158;
  uint local_138;
  uint local_118;
  int temp4;
  int temp3;
  int temp2_1;
  int temp1_1;
  WORD32 itr_count;
  __m128i temp2;
  __m128i temp1;
  __m128i src_temp7;
  __m128i src_temp6;
  __m128i src_temp5;
  __m128i src_temp4;
  
  iVar14 = in_R8D * 2;
  if (in_R8D == 0x20) {
    uVar8 = *(ulong *)(in_RDI + iVar14 + 1);
    uVar9 = *(ulong *)(in_RDI + iVar14 + 9);
    uVar10 = *(ulong *)(in_RDI + iVar14 + 0x11);
    uVar11 = *(ulong *)(in_RDI + iVar14 + 0x19);
    local_6b8 = in_RDX;
    for (local_77c = 0; local_77c < 2; local_77c = local_77c + 1) {
      *local_6b8 = uVar8;
      local_6b8[1] = uVar9;
      *(ulong *)((long)local_6b8 + (long)in_ECX) = uVar8;
      ((ulong *)((long)local_6b8 + (long)in_ECX))[1] = uVar9;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX << 1));
      *puVar15 = uVar8;
      puVar15[1] = uVar9;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 3));
      *puVar15 = uVar8;
      puVar15[1] = uVar9;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX << 2));
      *puVar15 = uVar8;
      puVar15[1] = uVar9;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 5));
      *puVar15 = uVar8;
      puVar15[1] = uVar9;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 6));
      *puVar15 = uVar8;
      puVar15[1] = uVar9;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 7));
      *puVar15 = uVar8;
      puVar15[1] = uVar9;
      local_6b8[2] = uVar10;
      local_6b8[3] = uVar11;
      puVar15 = (ulong *)((long)local_6b8 + (long)in_ECX + 0x10);
      *puVar15 = uVar10;
      puVar15[1] = uVar11;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX << 1) + 0x10);
      *puVar15 = uVar10;
      puVar15[1] = uVar11;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 3) + 0x10);
      *puVar15 = uVar10;
      puVar15[1] = uVar11;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX << 2) + 0x10);
      *puVar15 = uVar10;
      puVar15[1] = uVar11;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 5) + 0x10);
      *puVar15 = uVar10;
      puVar15[1] = uVar11;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 6) + 0x10);
      *puVar15 = uVar10;
      puVar15[1] = uVar11;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 7) + 0x10);
      *puVar15 = uVar10;
      puVar15[1] = uVar11;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX << 3));
      *puVar15 = uVar8;
      puVar15[1] = uVar9;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 9));
      *puVar15 = uVar8;
      puVar15[1] = uVar9;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 10));
      *puVar15 = uVar8;
      puVar15[1] = uVar9;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 0xb));
      *puVar15 = uVar8;
      puVar15[1] = uVar9;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 0xc));
      *puVar15 = uVar8;
      puVar15[1] = uVar9;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 0xd));
      *puVar15 = uVar8;
      puVar15[1] = uVar9;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 0xe));
      *puVar15 = uVar8;
      puVar15[1] = uVar9;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 0xf));
      *puVar15 = uVar8;
      puVar15[1] = uVar9;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX << 3) + 0x10);
      *puVar15 = uVar10;
      puVar15[1] = uVar11;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 9) + 0x10);
      *puVar15 = uVar10;
      puVar15[1] = uVar11;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 10) + 0x10);
      *puVar15 = uVar10;
      puVar15[1] = uVar11;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 0xb) + 0x10);
      *puVar15 = uVar10;
      puVar15[1] = uVar11;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 0xc) + 0x10);
      *puVar15 = uVar10;
      puVar15[1] = uVar11;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 0xd) + 0x10);
      *puVar15 = uVar10;
      puVar15[1] = uVar11;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 0xe) + 0x10);
      *puVar15 = uVar10;
      puVar15[1] = uVar11;
      puVar15 = (ulong *)((long)local_6b8 + (long)(in_ECX * 0xf) + 0x10);
      *puVar15 = uVar10;
      puVar15[1] = uVar11;
      local_6b8 = (ulong *)((long)local_6b8 + (long)(in_ECX << 4));
    }
  }
  else {
    for (local_6c8 = in_R8D + -1; -1 < local_6c8; local_6c8 = local_6c8 + -1) {
      sVar13 = (ushort)*(byte *)(in_RDI + (iVar14 + 1)) +
               (short)((int)((uint)*(byte *)(in_RDI + ((iVar14 + -1) - local_6c8)) -
                            (uint)*(byte *)(in_RDI + iVar14)) >> 1);
      if (sVar13 < 0x100) {
        if (sVar13 < 0) {
          sVar13 = 0;
        }
        bVar1 = (byte)sVar13;
      }
      else {
        bVar1 = 0xff;
      }
      *(byte *)((long)in_RDX + (long)(local_6c8 * in_ECX)) = bVar1;
    }
    if (in_R8D == 4) {
      uVar12 = (uint)*(undefined8 *)(in_RDI + 1 + (long)iVar14);
      local_118 = uVar12 & 0xffffff00 | (uint)(byte)*in_RDX;
      local_138 = uVar12 & 0xffffff00 | (uint)*(byte *)((long)in_RDX + (long)in_ECX);
      local_158 = uVar12 & 0xffffff00 | (uint)*(byte *)((long)in_RDX + (long)(in_ECX * 2));
      local_178 = uVar12 & 0xffffff00 | (uint)*(byte *)((long)in_RDX + (long)(in_ECX * 3));
      *(uint *)in_RDX = local_118;
      *(uint *)((long)in_RDX + (long)in_ECX) = local_138;
      *(uint *)((long)in_RDX + (long)(in_ECX << 1)) = local_158;
      *(uint *)((long)in_RDX + (long)(in_ECX * 3)) = local_178;
    }
    else if (in_R8D == 8) {
      uVar8 = *(ulong *)(in_RDI + 1 + (long)iVar14);
      bVar1 = *(byte *)((long)in_RDX + (long)in_ECX);
      bVar2 = *(byte *)((long)in_RDX + (long)(in_ECX * 2));
      bVar3 = *(byte *)((long)in_RDX + (long)(in_ECX * 3));
      bVar4 = *(byte *)((long)in_RDX + (long)(in_ECX << 2));
      bVar5 = *(byte *)((long)in_RDX + (long)(in_ECX * 5));
      bVar6 = *(byte *)((long)in_RDX + (long)(in_ECX * 6));
      bVar7 = *(byte *)((long)in_RDX + (long)(in_ECX * 7));
      *in_RDX = uVar8 & 0xffffffffffffff00 | (ulong)(byte)*in_RDX;
      *(ulong *)((long)in_RDX + (long)in_ECX) = uVar8 & 0xffffffffffffff00 | (ulong)bVar1;
      *(ulong *)((long)in_RDX + (long)(in_ECX * 2)) = uVar8 & 0xffffffffffffff00 | (ulong)bVar2;
      *(ulong *)((long)in_RDX + (long)(in_ECX * 3)) = uVar8 & 0xffffffffffffff00 | (ulong)bVar3;
      *(ulong *)((long)in_RDX + (long)(in_ECX << 2)) = uVar8 & 0xffffffffffffff00 | (ulong)bVar4;
      *(ulong *)((long)in_RDX + (long)(in_ECX * 5)) = uVar8 & 0xffffffffffffff00 | (ulong)bVar5;
      *(ulong *)((long)in_RDX + (long)(in_ECX * 6)) = uVar8 & 0xffffffffffffff00 | (ulong)bVar6;
      *(ulong *)((long)in_RDX + (long)(in_ECX * 7)) = uVar8 & 0xffffffffffffff00 | (ulong)bVar7;
    }
    else if (in_R8D == 0x10) {
      for (local_6c8 = 0; local_6c8 < 0x10; local_6c8 = local_6c8 + 8) {
        puVar15 = (ulong *)(in_RDI + 1 + (long)iVar14);
        uVar8 = *puVar15;
        uVar9 = puVar15[1];
        bVar1 = *(byte *)((long)in_RDX + (long)((local_6c8 + 1) * in_ECX));
        bVar2 = *(byte *)((long)in_RDX + (long)((local_6c8 + 2) * in_ECX));
        bVar3 = *(byte *)((long)in_RDX + (long)((local_6c8 + 3) * in_ECX));
        bVar4 = *(byte *)((long)in_RDX + (long)((local_6c8 + 4) * in_ECX));
        bVar5 = *(byte *)((long)in_RDX + (long)((local_6c8 + 5) * in_ECX));
        bVar6 = *(byte *)((long)in_RDX + (long)((local_6c8 + 6) * in_ECX));
        bVar7 = *(byte *)((long)in_RDX + (long)((local_6c8 + 7) * in_ECX));
        puVar15 = (ulong *)((long)in_RDX + (long)(local_6c8 * in_ECX));
        *puVar15 = uVar8 & 0xffffffffffffff00 |
                   (ulong)*(byte *)((long)in_RDX + (long)(local_6c8 * in_ECX));
        puVar15[1] = uVar9;
        puVar15 = (ulong *)((long)in_RDX + (long)((local_6c8 + 1) * in_ECX));
        *puVar15 = uVar8 & 0xffffffffffffff00 | (ulong)bVar1;
        puVar15[1] = uVar9;
        puVar15 = (ulong *)((long)in_RDX + (long)((local_6c8 + 2) * in_ECX));
        *puVar15 = uVar8 & 0xffffffffffffff00 | (ulong)bVar2;
        puVar15[1] = uVar9;
        puVar15 = (ulong *)((long)in_RDX + (long)((local_6c8 + 3) * in_ECX));
        *puVar15 = uVar8 & 0xffffffffffffff00 | (ulong)bVar3;
        puVar15[1] = uVar9;
        puVar15 = (ulong *)((long)in_RDX + (long)((local_6c8 + 4) * in_ECX));
        *puVar15 = uVar8 & 0xffffffffffffff00 | (ulong)bVar4;
        puVar15[1] = uVar9;
        puVar15 = (ulong *)((long)in_RDX + (long)((local_6c8 + 5) * in_ECX));
        *puVar15 = uVar8 & 0xffffffffffffff00 | (ulong)bVar5;
        puVar15[1] = uVar9;
        puVar15 = (ulong *)((long)in_RDX + (long)((local_6c8 + 6) * in_ECX));
        *puVar15 = uVar8 & 0xffffffffffffff00 | (ulong)bVar6;
        puVar15[1] = uVar9;
        puVar15 = (ulong *)((long)in_RDX + (long)((local_6c8 + 7) * in_ECX));
        *puVar15 = uVar8 & 0xffffffffffffff00 | (ulong)bVar7;
        puVar15[1] = uVar9;
      }
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_ver_sse42(UWORD8 *pu1_ref,
                                     WORD32 src_strd,
                                     UWORD8 *pu1_dst,
                                     WORD32 dst_strd,
                                     WORD32 nt,
                                     WORD32 mode)
{
    WORD32 row;
    WORD16 s2_predpixel;
    WORD32 two_nt = 2 * nt;
    __m128i src_temp0, src_temp1, src_temp2, src_temp3, src_temp4, src_temp5, src_temp6, src_temp7;

    UNUSED(src_strd);
    UNUSED(mode);

    if(nt == 32)
    {
        __m128i temp1, temp2;
        WORD32 itr_count;

        temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
        temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 16));

        for(itr_count = 0; itr_count < 2; itr_count++)
        {
            /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
            _mm_storeu_si128((__m128i *)(pu1_dst + ((0) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), temp1);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((0) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((1) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((2) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((3) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((4) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((5) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((6) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((7) * dst_strd)), temp2);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), temp1);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((8) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((9) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((10) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((11) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((12) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((13) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((14) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((15) * dst_strd)), temp2);

            pu1_dst += 16 * dst_strd;
        }
    }

    else

    {
        /*Filtering done for the 1st column */
        for(row = nt - 1; row >= 0; row--)
        {
            s2_predpixel = pu1_ref[two_nt + 1]
                            + ((pu1_ref[two_nt - 1 - row] - pu1_ref[two_nt]) >> 1);
            pu1_dst[row * dst_strd] = CLIP_U8(s2_predpixel);
        }

        /* Replication to next columns*/

        if(nt == 4)
        {
            int temp1, temp2, temp3, temp4;

            src_temp2 =   _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp3 =  src_temp2;
            src_temp4 =  src_temp2;
            src_temp5 =  src_temp2;

            src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[(0 * dst_strd)], 0);
            src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[(1 * dst_strd)], 0);
            src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[(2 * dst_strd)], 0);
            src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[(3 * dst_strd)], 0);

            temp1 = _mm_cvtsi128_si32(src_temp2);
            temp2 = _mm_cvtsi128_si32(src_temp3);
            temp3 = _mm_cvtsi128_si32(src_temp4);
            temp4 = _mm_cvtsi128_si32(src_temp5);

            /* loding 4-bit 8 pixels values */
            *(WORD32 *)(&pu1_dst[(0 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp3;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp4;

        }
        else if(nt == 8)
        {

            src_temp0 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp1 = src_temp0;
            src_temp2 = src_temp0;
            src_temp3 = src_temp0;
            src_temp4 = src_temp0;
            src_temp5 = src_temp0;
            src_temp6 = src_temp0;
            src_temp7 = src_temp0;

            src_temp0 = _mm_insert_epi8(src_temp0, pu1_dst[((0) * dst_strd)], 0);
            src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((1) * dst_strd)], 0);
            src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[((2) * dst_strd)], 0);
            src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[((3) * dst_strd)], 0);
            src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[((4) * dst_strd)], 0);
            src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[((5) * dst_strd)], 0);
            src_temp6 = _mm_insert_epi8(src_temp6, pu1_dst[((6) * dst_strd)], 0);
            src_temp7 = _mm_insert_epi8(src_temp7, pu1_dst[((7) * dst_strd)], 0);

            _mm_storel_epi64((__m128i *)(pu1_dst + ((0) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);


        }
        else if(nt == 16)
        {
            for(row = 0; row < nt; row += 8)
            {

                src_temp0 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
                src_temp1 = src_temp0;
                src_temp2 = src_temp0;
                src_temp3 = src_temp0;
                src_temp4 = src_temp0;
                src_temp5 = src_temp0;
                src_temp6 = src_temp0;
                src_temp7 = src_temp0;

                src_temp0 = _mm_insert_epi8(src_temp0, pu1_dst[((row + 0) * dst_strd)], 0);
                src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((row + 1) * dst_strd)], 0);
                src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[((row + 2) * dst_strd)], 0);
                src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[((row + 3) * dst_strd)], 0);
                src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[((row + 4) * dst_strd)], 0);
                src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[((row + 5) * dst_strd)], 0);
                src_temp6 = _mm_insert_epi8(src_temp6, pu1_dst[((row + 6) * dst_strd)], 0);
                src_temp7 = _mm_insert_epi8(src_temp7, pu1_dst[((row + 7) * dst_strd)], 0);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 4) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 7) * dst_strd)), src_temp7);

            }

        }


    }
}